

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_benchmark.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *other;
  int iVar2;
  bool bVar3;
  double dVar4;
  double elapsed;
  double extraout_XMM0_Qa;
  expr e;
  Timer timer;
  double eps;
  expr e_opt;
  variable T;
  variable x;
  double mult;
  double local_150;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_148;
  Timer local_140;
  auto_ptr<const_viennamath::rt_expression_interface<double>_> local_138;
  double local_130;
  double local_128;
  double local_120;
  type local_118;
  double local_f8;
  double local_f0;
  double local_e8;
  rt_variable<viennamath::rt_expression_interface<double>_> local_e0;
  rt_variable<viennamath::rt_expression_interface<double>_> local_d0;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> local_c0;
  type local_a8;
  type local_88;
  type local_68;
  type local_48;
  double local_28;
  
  local_140.ts = 0;
  local_128 = 8.854e-12;
  poVar1 = std::operator<<((ostream *)&std::cout,"**** ViennaMath performance benchmark ****");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Make sure that optimization flags (e.g. -O2) are set when benchmarking!"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Enter \'1\': ");
  std::istream::_M_extract<double>((double *)&std::cin);
  local_130 = (local_28 + local_28) * local_28 * 3.0;
  local_f8 = local_28 * 300.0;
  local_120 = local_28 * 1.61;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------- Naive (standard) implementation --------- ");
  std::endl<char,std::char_traits<char>>(poVar1);
  Timer::start(&local_140);
  local_150 = 0.0;
  iVar2 = 1000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_f0 = local_128 * local_f8 + local_128 * local_f8;
    dVar4 = exp(local_130 / (local_120 * local_f8));
    local_150 = local_150 + dVar4 * local_f0;
  }
  dVar4 = Timer::get(&local_140);
  print_stats(local_150,dVar4);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "--------- Hand tuned implementation (best possible, but will never be achieved within a simulator) --------- "
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  Timer::start(&local_140);
  dVar4 = 0.0;
  iVar2 = 1000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    dVar4 = dVar4 + 5.3788048e-09;
  }
  elapsed = Timer::get(&local_140);
  print_stats(dVar4,elapsed);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------- ViennaMath (runtime) --------- ");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_d0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001118a0;
  local_d0.id_ = 0;
  local_e0.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001118a0;
  local_e0.id_ = 1;
  viennamath::result_of::
  mult<viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_double,_false,_false>
  ::instance(&local_68,&local_e0,&local_128);
  viennamath::result_of::
  mult<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_48,&local_68,&local_d0);
  local_e8 = local_130;
  viennamath::result_of::
  mult<double,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_a8,&local_120,&local_e0);
  viennamath::result_of::
  div<double,_viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_88,&local_e8,&local_a8);
  viennamath::exp<viennamath::rt_expression_interface<double>>
            (&local_c0,(viennamath *)&local_88,other);
  viennamath::result_of::
  mult<viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>,_false,_false>
  ::instance(&local_118,&local_48,&local_c0);
  viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
            ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_148,&local_118);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_118);
  viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::~rt_unary_expr(&local_c0)
  ;
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_88);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_a8);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_48);
  viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr
            (&local_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Expression before substitution: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_148);
  std::endl<char,std::char_traits<char>>(poVar1);
  viennamath::substitute<viennamath::rt_expression_interface<double>>
            ((viennamath *)&local_118,&local_e0,300.0,
             (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_148);
  poVar1 = std::operator<<((ostream *)&std::cout,"Expression after substitution: ");
  poVar1 = viennamath::operator<<
                     (poVar1,(rt_expr<viennamath::rt_expression_interface<double>_> *)&local_118);
  std::endl<char,std::char_traits<char>>(poVar1);
  Timer::start(&local_140);
  local_150 = 0.0;
  iVar2 = 1000000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    viennamath::rt_expr<viennamath::rt_expression_interface<double>_>::rt_expr
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)&local_138,
               (rt_expr<viennamath::rt_expression_interface<double>_> *)&local_118);
    (*(local_138._M_ptr)->_vptr_rt_expression_interface[6])(0x4000000000000000);
    local_150 = local_150 + extraout_XMM0_Qa;
    if (local_138._M_ptr != (rt_expression_interface<double> *)0x0) {
      (*(local_138._M_ptr)->_vptr_rt_expression_interface[1])();
    }
  }
  dVar4 = Timer::get(&local_140);
  print_stats(local_150,dVar4);
  poVar1 = std::operator<<((ostream *)&std::cout,"--------- ViennaMath (compiletime) --------- ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  * (not possible in this case)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "****************************************************");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (local_118.super_rt_expression_interface<double>._vptr_rt_expression_interface !=
      (_func_int **)0x0) {
    (**(code **)(*local_118.super_rt_expression_interface<double>._vptr_rt_expression_interface + 8)
    )();
  }
  if (local_148._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_148._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  return 0;
}

Assistant:

int main()
{
  Timer timer;
  double elapsed;
  double result = 0;
  double x_ref = 2.0;
  double T_ref = 300;
  double kb = 1.61;
  double voltage = 3.0;
  double prefactor = 2.0;
  double eps = 8.854e-12;

  double mult;

  std::cout << "**** ViennaMath performance benchmark ****" << std::endl;
  std::cout << "Make sure that optimization flags (e.g. -O2) are set when benchmarking!" << std::endl;

  //
  // First step: disable precomputations by the compiler for naive implementation
  // If not specified at runtime, compiler might detect voltage and prefactor to be constants and precompute results
  std::cout << "Enter '1': ";
  std::cin >> mult;
  voltage *= mult;
  prefactor *= mult;
  T_ref *= mult;
  kb *= mult;

  std::cout << "--------- Naive (standard) implementation --------- " << std::endl;

  //the reference implementation:
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += (T_ref * eps * x_ref * ::exp( prefactor * voltage / (kb * T_ref) ) );
  elapsed = timer.get();


  print_stats(result, elapsed);


  std::cout << "--------- Hand tuned implementation (best possible, but will never be achieved within a simulator) --------- " << std::endl;

  //the reference implementation:
  result = 0;
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += 2.6894024e-9 * x_ref;
  elapsed = timer.get();

  print_stats(result, elapsed);



  std::cout << "--------- ViennaMath (runtime) --------- " << std::endl;

  //ViennaMath:
  viennamath::variable  x(0);
  viennamath::variable  T(1);
  viennamath::expr e = (T * eps * x * viennamath::exp( prefactor * voltage / (kb * T) ) );
  std::cout << "Expression before substitution: " << e << std::endl;
  viennamath::expr e_opt = viennamath::substitute(T, 300.0, e);
  std::cout << "Expression after substitution: " << e_opt << std::endl;
  result = 0;
  timer.start();
  for (int i=0; i<BENCHMARK_SIZE; ++i)
    result += viennamath::eval(e_opt, 2.0);
  elapsed = timer.get();

  print_stats(result, elapsed);


  std::cout << "--------- ViennaMath (compiletime) --------- " << std::endl;
  std::cout << "|" << std::endl;
  std::cout << "|  * (not possible in this case)" << std::endl;
  std::cout << "|" << std::endl;

  std::cout << "****************************************************" << std::endl;
  std::cout << "*****     TUTORIAL COMPLETED SUCCESSFULLY!     *****" << std::endl;
  std::cout << "****************************************************" << std::endl;

  return EXIT_SUCCESS;
}